

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O2

Result<wasm::Global_*> * __thiscall
wasm::WATParser::ParseDeclsCtx::addGlobalDecl
          (Result<wasm::Global_*> *__return_storage_ptr__,ParseDeclsCtx *this,Index pos,Name name,
          ImportNames *importNames)

{
  int __val;
  Global *pGVar1;
  _Variant_storage<false,wasm::Global*,wasm::Err> *p_Var2;
  char *pcVar3;
  IString IVar4;
  string local_b0;
  string local_90;
  string_view local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  _Variant_storage<false,wasm::Global*,wasm::Err> *local_40;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_38;
  __single_object g;
  
  local_40 = (_Variant_storage<false,wasm::Global*,wasm::Err> *)__return_storage_ptr__;
  std::make_unique<wasm::Global>();
  if (name.super_IString.str._M_str == (char *)0x0) {
    __val = this->globalCounter;
    this->globalCounter = __val + 1;
    std::__cxx11::to_string(&local_90,__val);
    pcVar3 = "gimport$";
    if (importNames == (ImportNames *)0x0) {
      pcVar3 = "global$";
    }
    std::operator+(&local_60,pcVar3,&local_90);
    IString::IString((IString *)&local_70,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_90);
    IVar4.str = (string_view)Names::getValidGlobalName(this->wasm,local_70);
    *(string_view *)
     local_38._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
     super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
     super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl = IVar4.str;
  }
  else {
    pGVar1 = Module::getGlobalOrNull(this->wasm,name);
    if (pGVar1 != (Global *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"repeated global name",(allocator<char> *)&local_90);
      Lexer::err((Err *)&local_60,&this->in,(ulong)pos,&local_b0);
      p_Var2 = local_40;
      std::__detail::__variant::_Variant_storage<false,wasm::Global*,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>(local_40,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_b0);
      goto LAB_00bfea2e;
    }
    *(size_t *)
     local_38._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
     super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
     super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl = name.super_IString.str._M_len;
    *(char **)((long)local_38._M_t.
                     super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                     super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 8) =
         name.super_IString.str._M_str;
    *(bool *)((long)local_38._M_t.
                    super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                    super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                    super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x10) = true;
  }
  if (importNames != (ImportNames *)0x0) {
    pcVar3 = (importNames->mod).super_IString.str._M_str;
    (((Global *)
     local_38._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
     super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
     super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->super_Importable).module.
    super_IString.str._M_len = (importNames->mod).super_IString.str._M_len;
    (((Global *)
     local_38._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
     super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
     super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->super_Importable).module.
    super_IString.str._M_str = pcVar3;
    pcVar3 = (importNames->nm).super_IString.str._M_str;
    (((Global *)
     local_38._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
     super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
     super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->super_Importable).base.
    super_IString.str._M_len = (importNames->nm).super_IString.str._M_len;
    (((Global *)
     local_38._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
     super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
     super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->super_Importable).base.
    super_IString.str._M_str = pcVar3;
  }
  pGVar1 = Module::addGlobal(this->wasm,&local_38);
  *(Global **)local_40 = pGVar1;
  local_40[0x20] = (_Variant_storage<false,wasm::Global*,wasm::Err>)0x0;
  p_Var2 = local_40;
LAB_00bfea2e:
  std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr(&local_38);
  return (Result<wasm::Global_*> *)p_Var2;
}

Assistant:

Result<Global*>
ParseDeclsCtx::addGlobalDecl(Index pos, Name name, ImportNames* importNames) {
  auto g = std::make_unique<Global>();
  if (name) {
    if (wasm.getGlobalOrNull(name)) {
      // TODO: if the existing global is not explicitly named, fix its name
      // and continue.
      return in.err(pos, "repeated global name");
    }
    g->setExplicitName(name);
  } else {
    name =
      (importNames ? "gimport$" : "global$") + std::to_string(globalCounter++);
    name = Names::getValidGlobalName(wasm, name);
    g->name = name;
  }
  applyImportNames(*g, importNames);
  return wasm.addGlobal(std::move(g));
}